

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

_Bool cpu_physical_memory_is_io_riscv64(AddressSpace *as,hwaddr phys_addr)

{
  _Bool _Var1;
  uint local_30;
  hwaddr hStack_28;
  _Bool res;
  hwaddr l;
  MemoryRegion_conflict *mr;
  hwaddr phys_addr_local;
  AddressSpace *as_local;
  
  hStack_28 = 1;
  mr = (MemoryRegion_conflict *)phys_addr;
  phys_addr_local = (hwaddr)as;
  l = (hwaddr)address_space_translate
                        (as,phys_addr,(hwaddr *)&mr,&stack0xffffffffffffffd8,false,
                         (MemTxAttrs)(local_30 & 0xff800000 | 1));
  _Var1 = memory_region_is_ram((MemoryRegion_conflict *)l);
  return (_Bool)((_Var1 ^ 0xffU) & 1);
}

Assistant:

bool cpu_physical_memory_is_io(AddressSpace *as, hwaddr phys_addr)
{
    MemoryRegion*mr;
    hwaddr l = 1;
    bool res;

    mr = address_space_translate(as,
                                 phys_addr, &phys_addr, &l, false,
                                 MEMTXATTRS_UNSPECIFIED);

    res = !memory_region_is_ram(mr);
    return res;
}